

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterNaive::Close(SscWriterNaive *this,int transportIndex)

{
  uint8_t *puVar1;
  Buffer *in_RDI;
  Buffer globalBuffer;
  int globalSize;
  size_t in_stack_ffffffffffffffb8;
  Buffer local_28;
  undefined4 local_10 [4];
  
  local_10[0] = 1;
  Buffer::Buffer(in_RDI,in_stack_ffffffffffffffb8);
  if (*(int *)&in_RDI[1].m_Buffer == 0) {
    MPI_Send(local_10,1,&ompi_mpi_int,*(undefined4 *)((long)&in_RDI[2].m_Capacity + 4),0,
             in_RDI->m_Buffer);
    puVar1 = Buffer::data(&local_28,0);
    MPI_Send(puVar1,local_10[0],&ompi_mpi_char,*(undefined4 *)((long)&in_RDI[2].m_Capacity + 4),0,
             in_RDI->m_Buffer);
  }
  Buffer::~Buffer(in_RDI);
  return;
}

Assistant:

void SscWriterNaive::Close(const int transportIndex)
{

    int globalSize = 1;
    ssc::Buffer globalBuffer(globalSize);
    if (m_WriterRank == 0)
    {
        MPI_Send(&globalSize, 1, MPI_INT, m_ReaderMasterStreamRank, 0, m_StreamComm);
        MPI_Send(globalBuffer.data(), globalSize, MPI_CHAR, m_ReaderMasterStreamRank, 0,
                 m_StreamComm);
    }
}